

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

FILE * startupfile(char *suffix,char *conffile,char *path,size_t len)

{
  int iVar1;
  char *pcVar2;
  int ret;
  char *home;
  FILE *ffp;
  size_t len_local;
  char *path_local;
  char *conffile_local;
  char *suffix_local;
  
  ffp = (FILE *)len;
  len_local = (size_t)path;
  path_local = conffile;
  conffile_local = suffix;
  pcVar2 = getenv("HOME");
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    if (path_local == (char *)0x0) {
      if (conffile_local == (char *)0x0) {
        iVar1 = snprintf((char *)len_local,(size_t)ffp,"%s/.mg",pcVar2);
        if ((iVar1 < 0) || (ffp <= (FILE *)(long)iVar1)) {
          return (FILE *)0x0;
        }
      }
      else {
        iVar1 = snprintf((char *)len_local,(size_t)ffp,"%s/.mg-%s",pcVar2,conffile_local);
        if ((iVar1 < 0) || (ffp <= (FILE *)(long)iVar1)) {
          return (FILE *)0x0;
        }
      }
    }
    else {
      strlcpy(len_local,path_local,ffp);
    }
    iVar1 = ffropen((FILE **)&home,(char *)len_local,(buffer *)0x0);
    if (iVar1 == 0) {
      return (FILE *)home;
    }
    if (iVar1 == 5) {
      ffclose((FILE *)home,(buffer *)0x0);
    }
  }
  return (FILE *)0x0;
}

Assistant:

FILE *
startupfile(char *suffix, char *conffile, char *path, size_t len)
{
	FILE		*ffp;
	char		*home;
	int		 ret;

	if ((home = getenv("HOME")) == NULL || *home == '\0')
		goto nohome;

	if (conffile != NULL) {
		(void)strlcpy(path, conffile, len);
	} else if (suffix == NULL) {
		ret = snprintf(path, len, _PATH_MG_STARTUP, home);
		if (ret < 0 || ret >= len)
			return (NULL);
	} else {
		ret = snprintf(path, len, _PATH_MG_TERM, home, suffix);
		if (ret < 0 || ret >= len)
			return (NULL);
	}

	ret = ffropen(&ffp, path, NULL);
	if (ret == FIOSUC)
		return (ffp);
	if (ret == FIODIR)
		(void)ffclose(ffp, NULL);
nohome:
#ifdef STARTUPFILE
	if (suffix == NULL) {
		ret = snprintf(path, len, "%s", STARTUPFILE);
		if (ret < 0 || ret >= len)
			return (NULL);
	} else {
		ret = snprintf(path, len, "%s%s", STARTUPFILE,
		    suffix);
		if (ret < 0 || ret >= len)
			return (NULL);
	}

	ret = ffropen(&ffp, path, NULL);
	if (ret == FIOSUC)
		return (ffp);
	if (ret == FIODIR)
		(void)ffclose(ffp, NULL);
#endif /* STARTUPFILE */
	return (NULL);
}